

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-clientsocket.c
# Opt level: O0

int lsend(lua_State *L)

{
  lua_Integer lVar1;
  char *buffer;
  char *msg;
  size_t sStack_18;
  int fd;
  size_t sz;
  lua_State *L_local;
  
  sStack_18 = 0;
  sz = (size_t)L;
  lVar1 = luaL_checkinteger(L,1);
  buffer = luaL_checklstring((lua_State *)sz,2,&stack0xffffffffffffffe8);
  block_send((lua_State *)sz,(int)lVar1,buffer,(int)sStack_18);
  return 0;
}

Assistant:

static int
lsend(lua_State *L) {
	size_t sz = 0;
	int fd = luaL_checkinteger(L,1);
	const char * msg = luaL_checklstring(L, 2, &sz);

	block_send(L, fd, msg, (int)sz);

	return 0;
}